

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlDOMWrapStoreNs(xmlDocPtr doc,xmlChar *nsName,xmlChar *prefix)

{
  int iVar1;
  _xmlNs *p_Var2;
  xmlNsPtr pxVar3;
  _xmlNs *p_Var4;
  
  p_Var2 = xmlTreeEnsureXMLDecl(doc);
  if (p_Var2 == (xmlNsPtr)0x0) {
    p_Var4 = (_xmlNs *)0x0;
  }
  else {
    do {
      p_Var4 = p_Var2->next;
      if (p_Var4 == (_xmlNs *)0x0) {
        pxVar3 = xmlNewNs((xmlNodePtr)0x0,nsName,prefix);
        p_Var2->next = pxVar3;
        return pxVar3;
      }
      p_Var2 = p_Var4;
    } while (((p_Var4->prefix != prefix) && (iVar1 = xmlStrEqual(p_Var4->prefix,prefix), iVar1 == 0)
             ) || (iVar1 = xmlStrEqual(p_Var4->href,nsName), iVar1 == 0));
  }
  return p_Var4;
}

Assistant:

static xmlNsPtr
xmlDOMWrapStoreNs(xmlDocPtr doc,
		   const xmlChar *nsName,
		   const xmlChar *prefix)
{
    xmlNsPtr ns;

    if (doc == NULL)
	return (NULL);
    ns = xmlTreeEnsureXMLDecl(doc);
    if (ns == NULL)
	return (NULL);
    if (ns->next != NULL) {
	/* Reuse. */
	ns = ns->next;
	while (ns != NULL) {
	    if (((ns->prefix == prefix) ||
		xmlStrEqual(ns->prefix, prefix)) &&
		xmlStrEqual(ns->href, nsName)) {
		return (ns);
	    }
	    if (ns->next == NULL)
		break;
	    ns = ns->next;
	}
    }
    /* Create. */
    if (ns != NULL) {
        ns->next = xmlNewNs(NULL, nsName, prefix);
        return (ns->next);
    }
    return(NULL);
}